

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEFetchRow<signed_char>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  unsigned_long skip_count;
  data_ptr_t pdVar1;
  RLEScanState<signed_char> scan_state;
  RLEScanState<signed_char> RStack_68;
  
  RLEScanState<signed_char>::RLEScanState(&RStack_68,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  RLEScanState<signed_char>::Skip(&RStack_68,segment,skip_count);
  pdVar1 = BufferHandle::Ptr(&RStack_68.handle);
  result->data[result_idx] = pdVar1[RStack_68.entry_pos + 8 + segment->offset];
  RLEScanState<signed_char>::~RLEScanState(&RStack_68);
  return;
}

Assistant:

void RLEFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RLEScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto result_data = FlatVector::GetData<T>(result);
	result_data[result_idx] = data_pointer[scan_state.entry_pos];
}